

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GregorianCalendar.cpp
# Opt level: O0

void __thiscall GregorianCalendar::GregorianCalendar(GregorianCalendar *this,int date)

{
  int iVar1;
  int d;
  int iVar2;
  undefined1 local_60 [8];
  GregorianCalendar t;
  GregorianCalendar local_30;
  int local_14;
  GregorianCalendar *pGStack_10;
  int date_local;
  GregorianCalendar *this_local;
  
  local_14 = date;
  pGStack_10 = this;
  Calendar::Calendar(&this->super_Calendar);
  (this->super_Calendar)._vptr_Calendar = (_func_int **)&PTR_getDefYearLen_001f6600;
  (this->super_Calendar).year = local_14 / 0x16e;
  while( true ) {
    iVar2 = local_14;
    GregorianCalendar(&local_30,1,1,(this->super_Calendar).year + 1);
    iVar1 = operator_cast_to_int(&local_30);
    if (iVar2 < iVar1) break;
    (this->super_Calendar).year = (this->super_Calendar).year + 1;
  }
  (this->super_Calendar).month = 1;
  while( true ) {
    iVar1 = local_14;
    iVar2 = (this->super_Calendar).month;
    d = LastMonthDay((this->super_Calendar).month,(this->super_Calendar).year);
    GregorianCalendar((GregorianCalendar *)&t.super_Calendar.day,iVar2,d,(this->super_Calendar).year
                     );
    iVar2 = operator_cast_to_int((GregorianCalendar *)&t.super_Calendar.day);
    if (iVar1 <= iVar2) break;
    (this->super_Calendar).month = (this->super_Calendar).month + 1;
  }
  GregorianCalendar((GregorianCalendar *)local_60,(this->super_Calendar).month,1,
                    (this->super_Calendar).year);
  iVar2 = local_14;
  iVar1 = operator_cast_to_int((GregorianCalendar *)local_60);
  (this->super_Calendar).day = (iVar2 - iVar1) + 1;
  return;
}

Assistant:

GregorianCalendar::GregorianCalendar(int date) {
    year = date / (365 + 1);
    while (date >= GregorianCalendar(1, 1, year + 1))
        year++;
    month = 1;
    while (date > GregorianCalendar(month, LastMonthDay(month, year), year))
        month++;
    GregorianCalendar t = GregorianCalendar(month, 1, year);
    day = date - t + 1;
}